

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

void __thiscall bodyArg::term_async(bodyArg *this)

{
  if (this->datasource != (CVmDataSource *)0x0) {
    (*this->datasource->_vptr_CVmDataSource[1])();
  }
  if (this->gv != (vm_globalvar_t *)0x0) {
    CVmObjTable::delete_global_var(&G_obj_table_X,this->gv);
    return;
  }
  return;
}

Assistant:

void term_async(VMG0_)
    {
        /* delete our data source */
        if (datasource != 0)
            delete datasource;

        /* delete our VM global */
        if (gv != 0)
            G_obj_table->delete_global_var(gv);
    }